

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O3

Matrix3x3 * __thiscall
CGL::Matrix3x3::operator*(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,Matrix3x3 *B)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int i_1;
  long lVar3;
  int k;
  double *pdVar4;
  int i;
  long lVar5;
  Vector3D *pVVar6;
  long lVar7;
  Vector3D *pVVar8;
  double dVar9;
  undefined1 auVar10 [16];
  bool bVar12;
  undefined8 uVar13;
  long lVar11;
  
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  auVar2 = _DAT_001900d0;
  auVar1 = _DAT_001900c0;
  lVar3 = 0;
  lVar5 = 0;
  pdVar4 = (double *)__return_storage_ptr__;
  do {
    lVar7 = 0;
    auVar10 = auVar1;
    do {
      bVar12 = SUB164(auVar10 ^ auVar2,4) == -0x80000000 && SUB164(auVar10 ^ auVar2,0) < -0x7ffffffd
      ;
      if (bVar12) {
        uVar13 = 0x3ff0000000000000;
        if (lVar3 != lVar7) {
          uVar13 = 0;
        }
        *(undefined8 *)((long)pdVar4 + lVar7) = uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3ff0000000000000;
        if (lVar3 + -0x18 != lVar7) {
          uVar13 = 0;
        }
        *(undefined8 *)((long)pdVar4 + lVar7 + 0x18) = uVar13;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0x60);
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 0x18;
    pdVar4 = pdVar4 + 1;
  } while (lVar5 != 3);
  lVar3 = 0;
  do {
    lVar5 = 0;
    pVVar6 = B->entries;
    do {
      dVar9 = 0.0;
      lVar7 = 0;
      pVVar8 = this->entries;
      do {
        dVar9 = dVar9 + ((Vector3D *)&pVVar8->x)->x * (&((Vector3D *)&pVVar6->x)->x)[lVar7];
        lVar7 = lVar7 + 1;
        pVVar8 = pVVar8 + 1;
      } while (lVar7 != 3);
      (&__return_storage_ptr__->entries[lVar5].x)[lVar3] = dVar9;
      lVar5 = lVar5 + 1;
      pVVar6 = pVVar6 + 1;
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    this = (Matrix3x3 *)&this->entries[0].y;
  } while (lVar3 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = 0.;

       for( int k = 0; k < 3; k++ )
       {
          C(i,j) += A(i,k)*B(k,j);
       }
    }

    return C;
  }